

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

void __thiscall icu_63::FCDUTF8CollationIterator::switchToForward(FCDUTF8CollationIterator *this)

{
  int iVar1;
  int32_t iVar2;
  State SVar3;
  
  SVar3 = CHECK_FWD;
  if (this->state != IN_FCD_SEGMENT) {
    if (this->state == CHECK_BWD) {
      iVar1 = (this->super_UTF8CollationIterator).pos;
      this->start = iVar1;
      SVar3 = (uint)(iVar1 != this->limit) * 2;
    }
    else {
      iVar2 = this->limit;
      (this->super_UTF8CollationIterator).pos = iVar2;
      this->start = iVar2;
      SVar3 = CHECK_FWD;
    }
  }
  this->state = SVar3;
  return;
}

Assistant:

void
FCDUTF8CollationIterator::switchToForward() {
    U_ASSERT(state == CHECK_BWD ||
             (state == IN_FCD_SEGMENT && pos == limit) ||
             (state == IN_NORMALIZED && pos == normalized.length()));
    if(state == CHECK_BWD) {
        // Turn around from backward checking.
        start = pos;
        if(pos == limit) {
            state = CHECK_FWD;  // Check forward.
        } else {  // pos < limit
            state = IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the end of the FCD segment.
        if(state == IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it forward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking forward from it.
            start = pos = limit;
        }
        state = CHECK_FWD;
    }
}